

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-timesamples.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTimeSampleValue(AsciiParser *this,uint32_t type_id,Value *result)

{
  _Alloc_hider _Var1;
  bool bVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ostream *poVar4;
  long *plVar5;
  long lVar6;
  size_type *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  uint32_t tyid;
  uint32_t tyid_00;
  uint32_t tyid_01;
  uint32_t tyid_02;
  uint32_t tyid_03;
  uint32_t tyid_04;
  int iVar9;
  size_type *psVar10;
  undefined8 uVar11;
  byte bVar12;
  texcoord3f typed_val_1;
  token typed_val;
  Value val;
  ostringstream ss_e;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [8];
  float afStack_258 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined1 local_240 [4];
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  _Alloc_hider local_220;
  float fStack_218;
  float fStack_214;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_210;
  double local_200;
  double dStack_1f8;
  double local_1f0;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  storage_union local_1c0;
  undefined **local_1b0;
  half2 local_1a8;
  undefined4 uStack_1a4;
  float fStack_1a0;
  undefined4 uStack_19c;
  vtable_type *local_198;
  ios_base local_138 [264];
  
  bVar12 = 0;
  if (result == (Value *)0x0) {
    return false;
  }
  bVar2 = MaybeNone(this);
  if (bVar2) {
    local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::ValueBlock>()::table;
    linb::any::swap((any *)&local_1a8,&result->v_);
    if (local_198 != (vtable_type *)0x0) {
      (*local_198->destroy)((storage_union *)&local_1a8);
    }
    return true;
  }
  local_1b0 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_1c0.dynamic = (void *)0x0;
  switch(type_id) {
  case 6:
    _local_240 = (pointer)&local_230;
    fStack_238 = 0.0;
    fStack_234 = 0.0;
    local_230._M_allocated_capacity._0_4_ = local_230._M_allocated_capacity._0_4_ & 0xffffff00;
    bVar2 = ReadBasicType(this,(token *)local_240);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                 ,0x62);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x6d);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      tinyusdz::value::GetTypeName_abi_cxx11_((string *)local_260,(value *)(ulong)type_id,tyid_01);
      plVar5 = (long *)::std::__cxx11::string::replace((ulong)local_260,0,(char *)0x0,0x3cd308);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_280.field_2._M_allocated_capacity = *psVar7;
        local_280.field_2._8_8_ = plVar5[3];
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      }
      else {
        local_280.field_2._M_allocated_capacity = *psVar7;
        local_280._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_280._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_280);
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar3) {
        local_2a0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_2a0.field_2._8_8_ = plVar5[3];
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      }
      else {
        local_2a0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_2a0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_2a0._M_string_length = plVar5[1];
      *plVar5 = (long)paVar3;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a8,local_2a0._M_dataplus._M_p,
                          local_2a0._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
LAB_003ab74c:
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      goto LAB_003ab759;
    }
    local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::Token>()::table;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(0x20);
    paVar3->_M_allocated_capacity = (size_type)(paVar3->_M_local_buf + 0x10);
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)paVar3,_local_240,_local_240 + CONCAT44(fStack_234,fStack_238));
    _local_1a8 = paVar3;
LAB_003a9743:
    linb::any::operator=((any *)&local_1c0,(any *)&local_1a8);
    if (local_198 != (vtable_type *)0x0) {
      (*local_198->destroy)((storage_union *)&local_1a8);
      local_198 = (vtable_type *)0x0;
    }
    goto LAB_003ab7ca;
  case 7:
    _local_240 = (pointer)&local_230;
    fStack_238 = 0.0;
    fStack_234 = 0.0;
    local_230._M_allocated_capacity._0_4_ = (uint)(uint3)local_230._M_allocated_capacity._1_3_ << 8;
    bVar2 = ReadBasicType(this,(string *)local_240);
    if (bVar2) {
      tinyusdz::value::Value::Value<std::__cxx11::string>
                ((Value *)&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
      goto LAB_003a9743;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x6e);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    tinyusdz::value::GetTypeName_abi_cxx11_((string *)local_260,(value *)(ulong)type_id,tyid_02);
    ::std::operator+(&local_280,"Failed to parse value with requested type `",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260)
    ;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_280);
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar3) {
      local_2a0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
      local_2a0.field_2._8_8_ = plVar5[3];
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    }
    else {
      local_2a0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
      local_2a0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_2a0._M_string_length = plVar5[1];
    *plVar5 = (long)paVar3;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,local_2a0._M_dataplus._M_p,local_2a0._M_string_length)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) goto LAB_003ab74c;
LAB_003ab759:
    if (local_260 != (undefined1  [8])&local_250) {
      operator_delete((void *)local_260,local_250._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    ::std::ios_base::~ios_base(local_138);
LAB_003ab7ca:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_240 != &local_230) {
LAB_003ab7d8:
      operator_delete(_local_240,
                      CONCAT44(local_230._M_allocated_capacity._4_4_,
                               local_230._M_allocated_capacity._0_4_) + 1);
    }
    goto LAB_003ab4c1;
  default:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x95);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    tinyusdz::value::GetTypeName_abi_cxx11_(&local_2a0,(value *)(ulong)type_id,tyid);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                     " : TODO: timeSamples type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a0
                    );
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,(char *)CONCAT44(fStack_23c,local_240),
                        CONCAT44(fStack_234,fStack_238));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(fStack_23c,local_240) != &local_230) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(fStack_23c,local_240),
                      CONCAT44(local_230._M_allocated_capacity._4_4_,
                               local_230._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(fStack_23c,local_240) != &local_230) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(fStack_23c,local_240),
                      CONCAT44(local_230._M_allocated_capacity._4_4_,
                               local_230._M_allocated_capacity._0_4_) + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    ::std::ios_base::~ios_base(local_138);
    goto LAB_003ab4da;
  case 0xe:
    bVar2 = ReadBasicType(this,(half *)local_260);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                 ,0x62);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
      iVar9 = 0x77;
      break;
    }
    local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::half>()::table;
    local_1a8._M_elems[0].value = local_260._0_2_;
LAB_003a9b09:
    linb::any::operator=((any *)&local_1c0,(any *)&local_1a8);
    if (local_198 != (vtable_type *)0x0) {
      (*local_198->destroy)((storage_union *)&local_1a8);
      local_198 = (vtable_type *)0x0;
    }
    goto LAB_003ab4c1;
  case 0xf:
    bVar2 = ReadBasicType(this,(int *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<int>()::table;
LAB_003a9865:
      local_1a8._M_elems = (_Type)local_260._0_4_;
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x70;
    break;
  case 0x10:
    bVar2 = ReadBasicType(this,(int64_t *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<long>()::table;
      _local_1a8 = local_260;
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x75;
    break;
  case 0x11:
    bVar2 = ReadBasicType(this,(half2 *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)
                  linb::any::vtable_for_type<std::array<tinyusdz::value::half,2ul>>()::table;
      goto LAB_003a9865;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x78;
    break;
  case 0x12:
    bVar2 = ReadBasicType(this,(half3 *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)
                  linb::any::vtable_for_type<std::array<tinyusdz::value::half,3ul>>()::table;
      _local_1a8 = local_260._0_6_;
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x79;
    break;
  case 0x13:
    bVar2 = ReadBasicType(this,(half4 *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)
                  linb::any::vtable_for_type<std::array<tinyusdz::value::half,4ul>>()::table;
      _local_1a8 = local_260;
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x7a;
    break;
  case 0x14:
    bVar2 = ReadBasicType(this,(int2 *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<int,2ul>>()::table;
      _local_1a8 = local_260;
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x71;
    break;
  case 0x15:
    bVar2 = ReadBasicType(this,(int3 *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<int,3ul>>()::table;
LAB_003a9ab8:
      _local_1a8 = local_260;
      fStack_1a0 = afStack_258[0];
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x72;
    break;
  case 0x16:
    bVar2 = ReadBasicType(this,(int4 *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<int,4ul>>()::table;
LAB_003a9af4:
      _local_1a8 = local_260;
      fStack_1a0 = afStack_258[0];
      uStack_19c = afStack_258[1];
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x73;
    break;
  case 0x1b:
    bVar2 = ReadBasicType(this,(uint32_t *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<unsigned_int>()::table;
      goto LAB_003a9865;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x74;
    break;
  case 0x1c:
    bVar2 = ReadBasicType(this,(uint64_t *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<unsigned_long>()::table;
      _local_1a8 = local_260;
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x76;
    break;
  case 0x28:
    bVar2 = ReadBasicType(this,(float *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<float>()::table;
      local_1a8._M_elems = (_Type)local_260._0_4_;
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x6f;
    break;
  case 0x29:
    bVar2 = ReadBasicType(this,(float2 *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<float,2ul>>()::table;
      _local_1a8 = local_260;
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x7c;
    break;
  case 0x2a:
    bVar2 = ReadBasicType(this,(float3 *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<float,3ul>>()::table;
      goto LAB_003a9ab8;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x7d;
    break;
  case 0x2b:
    bVar2 = ReadBasicType(this,(float4 *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<float,4ul>>()::table;
      goto LAB_003a9af4;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x7e;
    break;
  case 0x2c:
    bVar2 = ReadBasicType(this,(double *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<double>()::table;
      _local_1a8 = local_260;
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x7f;
    break;
  case 0x2d:
    bVar2 = ReadBasicType(this,(double2 *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<double,2ul>>()::table;
      goto LAB_003a9af4;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x80;
    break;
  case 0x2e:
    bVar2 = ReadBasicType(this,(double3 *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<double,3ul>>()::table;
LAB_003a9662:
      _local_1a8 = operator_new(0x18);
      *(undefined1 (*) [8])_local_1a8 = local_260;
      *(float (*) [2])(_local_1a8 + 8) = afStack_258;
      *(size_type *)(_local_1a8 + 0x10) = local_250._M_allocated_capacity;
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x81;
    break;
  case 0x2f:
    bVar2 = ReadBasicType(this,(double4 *)local_240);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<double,4ul>>()::table;
LAB_003a99ea:
      _local_1a8 = operator_new(0x20);
      *(size_type *)_local_1a8 = CONCAT44(fStack_23c,local_240);
      *(ulong *)(_local_1a8 + 8) = CONCAT44(fStack_234,fStack_238);
      *(ulong *)(_local_1a8 + 0x10) =
           CONCAT44(local_230._M_allocated_capacity._4_4_,local_230._M_allocated_capacity._0_4_);
      *(undefined8 *)(_local_1a8 + 0x18) = local_230._8_8_;
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x82;
    goto LAB_003ab11d;
  case 0x30:
    bVar2 = ReadBasicType(this,(quath *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::quath>()::table;
      _local_1a8 = local_260;
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x83;
    break;
  case 0x31:
    bVar2 = ReadBasicType(this,(quatf *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::quatf>()::table;
      goto LAB_003a9af4;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x84;
    break;
  case 0x32:
    bVar2 = ReadBasicType(this,(quatd *)local_240);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::quatd>()::table;
      goto LAB_003a99ea;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x85;
    goto LAB_003ab11d;
  case 0x33:
    local_260._0_2_ = 0;
    local_260._2_2_ = 0x3f80;
    local_260._4_2_ = 0;
    local_260._6_2_ = 0;
    afStack_258[0] = 0.0;
    afStack_258[1] = 1.0;
    bVar2 = ReadBasicType(this,(matrix2f *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::matrix2f>()::table;
      goto LAB_003a9af4;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x8f;
    break;
  case 0x34:
    local_240 = (undefined1  [4])0x3f800000;
    fStack_23c = 0.0;
    fStack_238 = 0.0;
    fStack_234 = 0.0;
    local_230._M_allocated_capacity._0_4_ = 0x3f800000;
    local_230._M_allocated_capacity._4_4_ = 0;
    local_230._8_8_ = 0;
    local_220._M_p._0_4_ = 1.0;
    bVar2 = ReadBasicType(this,(matrix3f *)local_240);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::matrix3f>()::table;
      _local_1a8 = operator_new(0x24);
      *(size_type *)_local_1a8 = CONCAT44(fStack_23c,local_240);
      *(ulong *)(_local_1a8 + 8) = CONCAT44(fStack_234,fStack_238);
      *(ulong *)(_local_1a8 + 0x10) =
           CONCAT44(local_230._M_allocated_capacity._4_4_,local_230._M_allocated_capacity._0_4_);
      *(undefined8 *)(_local_1a8 + 0x18) = local_230._8_8_;
      *(float *)(_local_1a8 + 0x20) = local_220._M_p._0_4_;
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x90;
    goto LAB_003ab11d;
  case 0x35:
    local_240 = (undefined1  [4])0x3f800000;
    fStack_23c = 0.0;
    fStack_238 = 0.0;
    fStack_234 = 0.0;
    local_230._M_allocated_capacity._0_4_ = 0;
    local_230._M_allocated_capacity._4_4_ = 0x3f800000;
    local_230._8_8_ = 0;
    local_220._M_p = (pointer)0x0;
    fStack_218 = 1.0;
    fStack_214 = 0.0;
    aStack_210._M_allocated_capacity._0_4_ = 0;
    aStack_210._M_allocated_capacity._4_4_ = 0;
    aStack_210._8_4_ = 0;
    aStack_210._12_4_ = 0x3f800000;
    bVar2 = ReadBasicType(this,(matrix4f *)local_240);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::matrix4f>()::table;
      _local_1a8 = operator_new(0x40);
      *(size_type *)_local_1a8 = CONCAT44(fStack_23c,local_240);
      *(ulong *)(_local_1a8 + 8) = CONCAT44(fStack_234,fStack_238);
      *(ulong *)(_local_1a8 + 0x10) =
           CONCAT44(local_230._M_allocated_capacity._4_4_,local_230._M_allocated_capacity._0_4_);
      *(undefined8 *)(_local_1a8 + 0x18) = local_230._8_8_;
      *(pointer *)(_local_1a8 + 0x20) = local_220._M_p;
      *(ulong *)(_local_1a8 + 0x28) = CONCAT44(fStack_214,fStack_218);
      *(ulong *)(_local_1a8 + 0x30) =
           CONCAT44(aStack_210._M_allocated_capacity._4_4_,aStack_210._M_allocated_capacity._0_4_);
      *(ulong *)(_local_1a8 + 0x38) = CONCAT44(aStack_210._12_4_,aStack_210._8_4_);
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x91;
    goto LAB_003ab11d;
  case 0x36:
    local_240 = (undefined1  [4])0x0;
    fStack_23c = 1.875;
    fStack_238 = 0.0;
    fStack_234 = 0.0;
    local_230._M_allocated_capacity._0_4_ = 0;
    local_230._M_allocated_capacity._4_4_ = 0;
    local_230._8_8_ = 0x3ff0000000000000;
    bVar2 = ReadBasicType(this,(matrix2d *)local_240);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::matrix2d>()::table;
      goto LAB_003a99ea;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x92;
    goto LAB_003ab11d;
  case 0x37:
    local_240 = (undefined1  [4])0x0;
    fStack_23c = 1.875;
    fStack_238 = 0.0;
    fStack_234 = 0.0;
    local_230._M_allocated_capacity._0_4_ = 0;
    local_230._M_allocated_capacity._4_4_ = 0;
    local_230._8_8_ = 0;
    local_220._M_p = (pointer)0x3ff0000000000000;
    fStack_218 = 0.0;
    fStack_214 = 0.0;
    aStack_210._M_allocated_capacity._0_4_ = 0;
    aStack_210._M_allocated_capacity._4_4_ = 0;
    aStack_210._8_4_ = 0;
    aStack_210._12_4_ = 0;
    local_200 = 1.0;
    bVar2 = ReadBasicType(this,(matrix3d *)local_240);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::matrix3d>()::table;
      _local_1a8 = operator_new(0x48);
      lVar6 = 9;
LAB_003a9639:
      psVar10 = (size_type *)local_240;
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)_local_1a8;
      for (; lVar6 != 0; lVar6 = lVar6 + -1) {
        paVar3->_M_allocated_capacity = *psVar10;
        psVar10 = psVar10 + (ulong)bVar12 * -2 + 1;
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar3->_M_local_buf + (ulong)bVar12 * -0x10 + 8);
      }
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x93;
    goto LAB_003ab11d;
  case 0x38:
    local_240 = (undefined1  [4])0x0;
    fStack_23c = 1.875;
    fStack_238 = 0.0;
    fStack_234 = 0.0;
    local_230._M_allocated_capacity._0_4_ = 0;
    local_230._M_allocated_capacity._4_4_ = 0;
    local_230._8_8_ = 0;
    local_220._M_p = (pointer)0x0;
    fStack_218 = 0.0;
    fStack_214 = 1.875;
    aStack_210._M_allocated_capacity._0_4_ = 0;
    aStack_210._M_allocated_capacity._4_4_ = 0;
    aStack_210._8_4_ = 0;
    aStack_210._12_4_ = 0;
    local_200 = 0.0;
    dStack_1f8 = 0.0;
    local_1f0 = 1.0;
    local_1e8 = 0.0;
    dStack_1e0 = 0.0;
    local_1d8 = 0.0;
    dStack_1d0 = 0.0;
    local_1c8 = 1.0;
    bVar2 = ReadBasicType(this,(matrix4d *)local_240);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::matrix4d>()::table;
      _local_1a8 = operator_new(0x80);
      lVar6 = 0x10;
      goto LAB_003a9639;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x94;
    goto LAB_003ab11d;
  case 0x3a:
    bVar2 = ReadBasicType(this,(color3f *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::color3f>()::table;
      goto LAB_003a9ab8;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x86;
    break;
  case 0x3b:
    bVar2 = ReadBasicType(this,(color3d *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::color3d>()::table;
      goto LAB_003a9662;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x88;
    break;
  case 0x3d:
    bVar2 = ReadBasicType(this,(color4f *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::color4f>()::table;
      goto LAB_003a9af4;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x87;
    break;
  case 0x3e:
    bVar2 = ReadBasicType(this,(color4d *)local_240);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::color4d>()::table;
      goto LAB_003a99ea;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x89;
LAB_003ab11d:
    poVar4 = (ostream *)::std::ostream::operator<<(&local_1a8,iVar9);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    tinyusdz::value::GetTypeName_abi_cxx11_((string *)local_260,(value *)(ulong)type_id,tyid_03);
    ::std::operator+(&local_280,"Failed to parse value with requested type `",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260)
    ;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_280);
    paVar3 = &local_2a0.field_2;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar8) {
      local_2a0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_2a0.field_2._8_8_ = plVar5[3];
      local_2a0._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_2a0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_2a0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_2a0._M_string_length = plVar5[1];
    *plVar5 = (long)paVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,local_2a0._M_dataplus._M_p,local_2a0._M_string_length)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar3) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_260 != (undefined1  [8])&local_250) {
      operator_delete((void *)local_260,local_250._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_2a0);
    _Var1._M_p = (pointer)CONCAT44(fStack_23c,local_240);
    uVar11 = local_2a0.field_2._M_allocated_capacity;
    _local_240 = local_2a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar3) goto LAB_003ab498;
    goto LAB_003ab4a0;
  case 0x40:
    bVar2 = ReadBasicType(this,(point3f *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::point3f>()::table;
      goto LAB_003a9ab8;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x8c;
    break;
  case 0x43:
    bVar2 = ReadBasicType(this,(normal3f *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::normal3f>()::table;
      goto LAB_003a9ab8;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x8b;
    break;
  case 0x46:
    bVar2 = ReadBasicType(this,(vector3f *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::vector3f>()::table;
      goto LAB_003a9ab8;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x8a;
    break;
  case 0x4a:
    bVar2 = ReadBasicType(this,(texcoord2f *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::texcoord2f>()::table;
      _local_1a8 = local_260;
      goto LAB_003a9b09;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x8d;
    break;
  case 0x4d:
    bVar2 = ReadBasicType(this,(texcoord3f *)local_260);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::texcoord3f>()::table;
      goto LAB_003a9ab8;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    iVar9 = 0x8e;
    break;
  case 0x51:
    _local_240 = (pointer)&local_230;
    fStack_238 = 0.0;
    fStack_234 = 0.0;
    local_230._M_allocated_capacity._0_4_ = (uint)(uint3)local_230._M_allocated_capacity._1_3_ << 8;
    fStack_218 = 0.0;
    fStack_214 = 0.0;
    aStack_210._M_allocated_capacity._0_4_ = aStack_210._M_allocated_capacity._0_4_ & 0xffffff00;
    local_220._M_p = (pointer)&aStack_210;
    bVar2 = ReadBasicType(this,(AssetPath *)local_240);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::AssetPath>()::table;
      linb::any::do_construct<tinyusdz::value::AssetPath_const&,tinyusdz::value::AssetPath>
                ((any *)&local_1a8,(AssetPath *)local_240);
      linb::any::operator=((any *)&local_1c0,(any *)&local_1a8);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&local_1a8);
        local_198 = (vtable_type *)0x0;
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                 ,0x62);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x6c);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      tinyusdz::value::GetTypeName_abi_cxx11_((string *)local_260,(value *)(ulong)type_id,tyid_00);
      plVar5 = (long *)::std::__cxx11::string::replace((ulong)local_260,0,(char *)0x0,0x3cd308);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_280.field_2._M_allocated_capacity = *psVar7;
        local_280.field_2._8_8_ = plVar5[3];
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      }
      else {
        local_280.field_2._M_allocated_capacity = *psVar7;
        local_280._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_280._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_280);
      paVar3 = &local_2a0.field_2;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar8) {
        local_2a0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_2a0.field_2._8_8_ = plVar5[3];
        local_2a0._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_2a0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_2a0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_2a0._M_string_length = plVar5[1];
      *plVar5 = (long)paVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a8,local_2a0._M_dataplus._M_p,
                          local_2a0._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != paVar3) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != (undefined1  [8])&local_250) {
        operator_delete((void *)local_260,local_250._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != paVar3) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      ::std::ios_base::~ios_base(local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_p != &aStack_210) {
      operator_delete(local_220._M_p,
                      CONCAT44(aStack_210._M_allocated_capacity._4_4_,
                               aStack_210._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_240 == &local_230) goto LAB_003ab4c1;
    goto LAB_003ab7d8;
  }
  poVar4 = (ostream *)::std::ostream::operator<<(&local_1a8,iVar9);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  tinyusdz::value::GetTypeName_abi_cxx11_((string *)&local_280,(value *)(ulong)type_id,tyid_04);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a0,
                   "Failed to parse value with requested type `",&local_280);
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_2a0);
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar3) {
    local_230._8_8_ = plVar5[3];
    local_230._M_allocated_capacity._0_4_ = (undefined4)paVar3->_M_allocated_capacity;
    local_230._M_allocated_capacity._4_4_ = (undefined4)(paVar3->_M_allocated_capacity >> 0x20);
    _local_240 = (pointer)&local_230;
  }
  else {
    local_230._M_allocated_capacity._0_4_ = (undefined4)paVar3->_M_allocated_capacity;
    local_230._M_allocated_capacity._4_4_ = (undefined4)(paVar3->_M_allocated_capacity >> 0x20);
    _local_240 = (pointer)*plVar5;
  }
  lVar6 = plVar5[1];
  fStack_238 = (float)lVar6;
  fStack_234 = (float)((ulong)lVar6 >> 0x20);
  *plVar5 = (long)paVar3;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1a8,_local_240,lVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_240 != &local_230) {
    operator_delete(_local_240,
                    CONCAT44(local_230._M_allocated_capacity._4_4_,
                             local_230._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringbuf::str();
  PushError(this,(string *)local_240);
  _Var1._M_p = _local_240;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_240 != &local_230) {
    uVar11 = CONCAT44(local_230._M_allocated_capacity._4_4_,local_230._M_allocated_capacity._0_4_);
LAB_003ab498:
    operator_delete(_local_240,uVar11 + 1);
    _local_240 = _Var1._M_p;
    _Var1._M_p = _local_240;
  }
LAB_003ab4a0:
  _local_240 = _Var1._M_p;
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  ::std::ios_base::~ios_base(local_138);
LAB_003ab4c1:
  if (bVar2 == false) {
LAB_003ab4da:
    bVar2 = false;
  }
  else {
    linb::any::operator=(&result->v_,(any *)&local_1c0);
    bVar2 = true;
  }
  if (local_1b0 != (undefined **)0x0) {
    (*(code *)local_1b0[4])(&local_1c0);
  }
  return bVar2;
}

Assistant:

bool AsciiParser::ParseTimeSampleValue(const uint32_t type_id, value::Value *result) {

  if (!result) {
    return false;
  }

  if (MaybeNone()) {
    (*result) = value::ValueBlock();
    return true;
  }

  value::Value val;

#define PARSE_TYPE(__tyid, __type)                       \
  if (__tyid == value::TypeTraits<__type>::type_id()) {             \
    __type typed_val; \
    if (!ReadBasicType(&typed_val)) {                             \
      PUSH_ERROR_AND_RETURN("Failed to parse value with requested type `" + value::GetTypeName(__tyid) + "`"); \
    }                                                                  \
    val = value::Value(typed_val); \
  } else

  // NOTE: `string` does not support multi-line string.
  PARSE_TYPE(type_id, value::AssetPath)
  PARSE_TYPE(type_id, value::token)
  PARSE_TYPE(type_id, std::string)
  PARSE_TYPE(type_id, float)
  PARSE_TYPE(type_id, int32_t)
  PARSE_TYPE(type_id, value::int2)
  PARSE_TYPE(type_id, value::int3)
  PARSE_TYPE(type_id, value::int4)
  PARSE_TYPE(type_id, uint32_t)
  PARSE_TYPE(type_id, int64_t)
  PARSE_TYPE(type_id, uint64_t)
  PARSE_TYPE(type_id, value::half)
  PARSE_TYPE(type_id, value::half2)
  PARSE_TYPE(type_id, value::half3)
  PARSE_TYPE(type_id, value::half4)
  PARSE_TYPE(type_id, float)
  PARSE_TYPE(type_id, value::float2)
  PARSE_TYPE(type_id, value::float3)
  PARSE_TYPE(type_id, value::float4)
  PARSE_TYPE(type_id, double)
  PARSE_TYPE(type_id, value::double2)
  PARSE_TYPE(type_id, value::double3)
  PARSE_TYPE(type_id, value::double4)
  PARSE_TYPE(type_id, value::quath)
  PARSE_TYPE(type_id, value::quatf)
  PARSE_TYPE(type_id, value::quatd)
  PARSE_TYPE(type_id, value::color3f)
  PARSE_TYPE(type_id, value::color4f)
  PARSE_TYPE(type_id, value::color3d)
  PARSE_TYPE(type_id, value::color4d)
  PARSE_TYPE(type_id, value::vector3f)
  PARSE_TYPE(type_id, value::normal3f)
  PARSE_TYPE(type_id, value::point3f)
  PARSE_TYPE(type_id, value::texcoord2f)
  PARSE_TYPE(type_id, value::texcoord3f)
  PARSE_TYPE(type_id, value::matrix2f)
  PARSE_TYPE(type_id, value::matrix3f)
  PARSE_TYPE(type_id, value::matrix4f)
  PARSE_TYPE(type_id, value::matrix2d)
  PARSE_TYPE(type_id, value::matrix3d)
  PARSE_TYPE(type_id, value::matrix4d) {
    PUSH_ERROR_AND_RETURN(" : TODO: timeSamples type " + value::GetTypeName(type_id));
  }

#undef PARSE_TYPE

  (*result) = val;

  return true;
}